

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ConvertToHalfPass::GenConvert
          (ConvertToHalfPass *this,uint32_t *val_idp,uint32_t width,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t type_id;
  Analysis preserved_analyses;
  Op OVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  IRContext *context;
  undefined1 local_60 [8];
  InstructionBuilder builder;
  Instruction *cvt_inst;
  uint32_t nty_id;
  uint32_t ty_id;
  Instruction *val_inst;
  Instruction *inst_local;
  uint32_t width_local;
  uint32_t *val_idp_local;
  ConvertToHalfPass *this_local;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  this_01 = analysis::DefUseManager::GetDef(this_00,*val_idp);
  uVar1 = opt::Instruction::type_id(this_01);
  type_id = EquivFloatTypeId(this,uVar1,width);
  if (type_id != uVar1) {
    context = Pass::context(&this->super_Pass);
    preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)local_60,context,inst,preserved_analyses);
    OVar2 = opt::Instruction::opcode(this_01);
    if (OVar2 == OpUndef) {
      builder._24_8_ =
           InstructionBuilder::AddNullaryOp((InstructionBuilder *)local_60,type_id,OpUndef);
    }
    else {
      builder._24_8_ =
           InstructionBuilder::AddUnaryOp
                     ((InstructionBuilder *)local_60,type_id,OpFConvert,*val_idp);
    }
    uVar1 = opt::Instruction::result_id((Instruction *)builder._24_8_);
    *val_idp = uVar1;
  }
  return;
}

Assistant:

void ConvertToHalfPass::GenConvert(uint32_t* val_idp, uint32_t width,
                                   Instruction* inst) {
  Instruction* val_inst = get_def_use_mgr()->GetDef(*val_idp);
  uint32_t ty_id = val_inst->type_id();
  uint32_t nty_id = EquivFloatTypeId(ty_id, width);
  if (nty_id == ty_id) return;
  Instruction* cvt_inst;
  InstructionBuilder builder(
      context(), inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  if (val_inst->opcode() == spv::Op::OpUndef)
    cvt_inst = builder.AddNullaryOp(nty_id, spv::Op::OpUndef);
  else
    cvt_inst = builder.AddUnaryOp(nty_id, spv::Op::OpFConvert, *val_idp);
  *val_idp = cvt_inst->result_id();
}